

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::anon_unknown_14::XmlReporter::log_contexts(XmlReporter *this)

{
  XmlWriter *in_RDI;
  int i;
  stringstream ss;
  IContextScope **contexts;
  int num_contexts;
  allocator *in_stack_fffffffffffffda0;
  string *text;
  allocator *this_00;
  string *name;
  allocator local_229;
  string local_228 [32];
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [60];
  int local_1a4;
  stringstream local_1a0 [16];
  string asStack_190 [376];
  IContextScope **local_18;
  int local_c;
  
  local_c = IReporter::get_num_active_contexts();
  if (local_c != 0) {
    local_18 = IReporter::get_active_contexts();
    std::__cxx11::stringstream::stringstream(local_1a0);
    for (local_1a4 = 0; local_1a4 < local_c; local_1a4 = local_1a4 + 1) {
      name = (string *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x1a0) {
        name = asStack_190;
      }
      (*local_18[local_1a4]->_vptr_IContextScope[2])(local_18[local_1a4],name);
      text = (string *)&in_RDI->m_tags;
      this_00 = &local_1e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e0,"Info",this_00);
      XmlWriter::scopedElement(in_RDI,name);
      std::__cxx11::stringstream::str();
      XmlWriter::ScopedElement::writeText
                ((ScopedElement *)this_00,text,SUB81((ulong)in_stack_fffffffffffffda0 >> 0x38,0));
      std::__cxx11::string::~string(local_208);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      in_stack_fffffffffffffda0 = &local_229;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_228,"",in_stack_fffffffffffffda0);
      std::__cxx11::stringstream::str((string *)local_1a0);
      std::__cxx11::string::~string(local_228);
      std::allocator<char>::~allocator((allocator<char> *)&local_229);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void log_contexts() {
            int num_contexts = get_num_active_contexts();
            if(num_contexts) {
                auto              contexts = get_active_contexts();
                std::stringstream ss;
                for(int i = 0; i < num_contexts; ++i) {
                    contexts[i]->stringify(&ss);
                    xml.scopedElement("Info").writeText(ss.str());
                    ss.str("");
                }
            }
        }